

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O3

void deqp::gls::Functional::anon_unknown_0::drawQuad
               (Functions *gl,deUint32 program,Vec3 *p0,Vec3 *p1)

{
  GLuint GVar1;
  deUint16 indices [6];
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_68;
  float local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  float local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  float local_40;
  undefined4 local_3c;
  undefined8 local_38;
  float local_30;
  undefined4 local_2c;
  
  local_60 = p0->m_data[2];
  local_30 = p1->m_data[2];
  local_68 = *(undefined8 *)p0->m_data;
  local_50 = (local_60 + local_30) * 0.5;
  local_5c = 0x3f800000;
  local_58 = (undefined4)local_68;
  local_4c = 0x3f800000;
  local_44 = (undefined4)((ulong)local_68 >> 0x20);
  local_3c = 0x3f800000;
  local_38 = *(undefined8 *)p1->m_data;
  local_48 = (undefined4)local_38;
  local_54 = (undefined4)((ulong)local_38 >> 0x20);
  local_2c = 0x3f800000;
  local_78 = 0x2000200010000;
  local_70 = 0x30001;
  local_40 = local_50;
  GVar1 = (*gl->getAttribLocation)(program,"a_position");
  (*gl->useProgram)(program);
  (*gl->enableVertexAttribArray)(GVar1);
  (*gl->vertexAttribPointer)(GVar1,4,0x1406,'\0',0,&local_68);
  (*gl->drawElements)(4,6,0x1403,&local_78);
  (*gl->disableVertexAttribArray)(GVar1);
  return;
}

Assistant:

void drawQuad (const glw::Functions& gl, deUint32 program, const Vec3& p0, const Vec3& p1)
{
	// Vertex data.
	const float hz = (p0.z() + p1.z()) * 0.5f;
	const float position[] =
	{
		p0.x(), p0.y(), p0.z(),	1.0f,
		p0.x(), p1.y(), hz,		1.0f,
		p1.x(), p0.y(), hz,		1.0f,
		p1.x(), p1.y(), p1.z(),	1.0f
	};

	const deUint16	indices[]	= { 0, 1, 2, 2, 1, 3 };

	const deInt32	posLoc		= gl.getAttribLocation(program, "a_position");

	gl.useProgram(program);
	gl.enableVertexAttribArray(posLoc);
	gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);

	gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_SHORT, &indices[0]);

	gl.disableVertexAttribArray(posLoc);

}